

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::ItemSimilarityRecommender::_InternalParse
          (ItemSimilarityRecommender *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  ItemSimilarityRecommender_SimilarItems *msg;
  StringVector *msg_00;
  string *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  char cVar2;
  uint32_t tag;
  char *local_48;
  uint local_3c;
  InternalMetadata *local_38;
  
  local_38 = &(this->super_MessageLite)._internal_metadata_;
  local_48 = ptr;
LAB_0029415c:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_48);
    if (bVar1) {
      return local_48;
    }
    local_48 = google::protobuf::internal::ReadTag(local_48,&local_3c,0);
    tag_00 = local_3c;
    cVar2 = (char)local_3c;
    switch(local_3c >> 3) {
    case 1:
      if (cVar2 == '\n') {
        local_48 = local_48 + -1;
        do {
          local_48 = local_48 + 1;
          msg = google::protobuf::
                RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>::Add
                          (&this->itemitemsimilarities_);
          local_48 = google::protobuf::internal::ParseContext::ParseMessage
                               (ctx,&msg->super_MessageLite,local_48);
          if (local_48 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_48 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_48 == '\n'));
        goto LAB_0029415c;
      }
      break;
    case 2:
      if (cVar2 != '\x12') break;
      msg_00 = _internal_mutable_itemstringids(this);
LAB_00294228:
      local_48 = google::protobuf::internal::ParseContext::ParseMessage
                           (ctx,&msg_00->super_MessageLite,local_48);
      goto joined_r0x002942b3;
    case 3:
      if (cVar2 == '\x1a') {
        msg_00 = (StringVector *)_internal_mutable_itemint64ids(this);
        goto LAB_00294228;
      }
      break;
    case 10:
      if (cVar2 == 'R') {
        s = _internal_mutable_iteminputfeaturename_abi_cxx11_(this);
LAB_0029428a:
        local_48 = google::protobuf::internal::InlineGreedyStringParser(s,local_48,ctx);
        bVar1 = google::protobuf::internal::VerifyUTF8(s,(char *)0x0);
        if (!bVar1) {
          return (char *)0x0;
        }
        goto joined_r0x002942b3;
      }
      break;
    case 0xb:
      if (cVar2 == 'Z') {
        s = _internal_mutable_numrecommendationsinputfeaturename_abi_cxx11_(this);
        goto LAB_0029428a;
      }
      break;
    case 0xc:
      if (cVar2 == 'b') {
        s = _internal_mutable_itemrestrictioninputfeaturename_abi_cxx11_(this);
        goto LAB_0029428a;
      }
      break;
    case 0xd:
      if (cVar2 == 'j') {
        s = _internal_mutable_itemexclusioninputfeaturename_abi_cxx11_(this);
        goto LAB_0029428a;
      }
      break;
    case 0x14:
      if (cVar2 == -0x5e) {
        s = _internal_mutable_recommendeditemlistoutputfeaturename_abi_cxx11_(this);
        goto LAB_0029428a;
      }
      break;
    case 0x15:
      if (cVar2 == -0x56) {
        s = _internal_mutable_recommendeditemscoreoutputfeaturename_abi_cxx11_(this);
        goto LAB_0029428a;
      }
    }
    if ((local_3c == 0) || ((local_3c & 7) == 4)) {
      if (local_48 == (char *)0x0) {
        return (char *)0x0;
      }
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
      return local_48;
    }
    unknown = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields<std::__cxx11::string>(local_38);
    local_48 = google::protobuf::internal::UnknownFieldParse(tag_00,unknown,local_48,ctx);
joined_r0x002942b3:
    if (local_48 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* ItemSimilarityRecommender::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated .CoreML.Specification.ItemSimilarityRecommender.SimilarItems itemItemSimilarities = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_itemitemsimilarities(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.StringVector itemStringIds = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_itemstringids(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64Vector itemInt64Ids = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_itemint64ids(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string itemInputFeatureName = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 82)) {
          auto str = _internal_mutable_iteminputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string numRecommendationsInputFeatureName = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 90)) {
          auto str = _internal_mutable_numrecommendationsinputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string itemRestrictionInputFeatureName = 12;
      case 12:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 98)) {
          auto str = _internal_mutable_itemrestrictioninputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string itemExclusionInputFeatureName = 13;
      case 13:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 106)) {
          auto str = _internal_mutable_itemexclusioninputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string recommendedItemListOutputFeatureName = 20;
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 162)) {
          auto str = _internal_mutable_recommendeditemlistoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string recommendedItemScoreOutputFeatureName = 21;
      case 21:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 170)) {
          auto str = _internal_mutable_recommendeditemscoreoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}